

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMBaseInfo.h
# Opt level: O0

char * ARM_MB_MemBOptToString(uint val,_Bool HasV8)

{
  _Bool HasV8_local;
  char *pcStack_10;
  uint val_local;
  
  switch(val) {
  case 1:
    pcStack_10 = "#0x0";
    break;
  case 2:
    pcStack_10 = "#0x1";
    if (HasV8) {
      pcStack_10 = "oshld";
    }
    break;
  case 3:
    pcStack_10 = "oshst";
    break;
  case 4:
    pcStack_10 = "osh";
    break;
  case 5:
    pcStack_10 = "#0x4";
    break;
  case 6:
    pcStack_10 = "#0x5";
    if (HasV8) {
      pcStack_10 = "nshld";
    }
    break;
  case 7:
    pcStack_10 = "nshst";
    break;
  case 8:
    pcStack_10 = "nsh";
    break;
  case 9:
    pcStack_10 = "#0x8";
    break;
  case 10:
    pcStack_10 = "#0x9";
    if (HasV8) {
      pcStack_10 = "ishld";
    }
    break;
  case 0xb:
    pcStack_10 = "ishst";
    break;
  case 0xc:
    pcStack_10 = "ish";
    break;
  case 0xd:
    pcStack_10 = "#0xc";
    break;
  case 0xe:
    pcStack_10 = "#0xd";
    if (HasV8) {
      pcStack_10 = "ld";
    }
    break;
  case 0xf:
    pcStack_10 = "st";
    break;
  case 0x10:
    pcStack_10 = "sy";
    break;
  default:
    pcStack_10 = "BUGBUG";
  }
  return pcStack_10;
}

Assistant:

inline static char *ARM_MB_MemBOptToString(unsigned val, bool HasV8)
{
	switch (val) {
		default: return "BUGBUG";
		case ARM_MB_SY:    return "sy";
		case ARM_MB_ST:    return "st";
		case ARM_MB_LD: return HasV8 ? "ld" : "#0xd";
		case ARM_MB_RESERVED_12: return "#0xc";
		case ARM_MB_ISH:   return "ish";
		case ARM_MB_ISHST: return "ishst";
		case ARM_MB_ISHLD: return HasV8 ?  "ishld" : "#0x9";
		case ARM_MB_RESERVED_8: return "#0x8";
		case ARM_MB_NSH:   return "nsh";
		case ARM_MB_NSHST: return "nshst";
		case ARM_MB_NSHLD: return HasV8 ? "nshld" : "#0x5";
		case ARM_MB_RESERVED_4: return "#0x4";
		case ARM_MB_OSH:   return "osh";
		case ARM_MB_OSHST: return "oshst";
		case ARM_MB_OSHLD: return HasV8 ? "oshld" : "#0x1";
		case ARM_MB_RESERVED_0: return "#0x0";
	}
}